

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampBase.cpp
# Opt level: O2

char * __thiscall
glcts::TextureBorderClampBase::getPNameString(TextureBorderClampBase *this,GLenum pname)

{
  if ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR == pname) {
    return "GL_TEXTURE_BORDER_COLOR_EXT";
  }
  switch(pname) {
  case 0x2800:
    return "GL_TEXTURE_MAG_FILTER";
  case 0x2801:
    return "GL_TEXTURE_MIN_FILTER";
  case 0x2802:
    return "GL_TEXTURE_WRAP_S";
  case 0x2803:
    return "GL_TEXTURE_WRAP_T";
  }
  switch(pname) {
  case 0x813a:
    return "GL_TEXTURE_MIN_LOD";
  case 0x813b:
    return "GL_TEXTURE_MAX_LOD";
  case 0x813c:
    return "GL_TEXTURE_BASE_LEVEL";
  case 0x813d:
    return "GL_TEXTURE_MAX_LEVEL";
  }
  switch(pname) {
  case 0x8e42:
    return "GL_TEXTURE_SWIZZLE_R";
  case 0x8e43:
    return "GL_TEXTURE_SWIZZLE_G";
  case 0x8e44:
    return "GL_TEXTURE_SWIZZLE_B";
  case 0x8e45:
    return "GL_TEXTURE_SWIZZLE_A";
  }
  if (pname == 0x8072) {
    return "GL_TEXTURE_WRAP_R";
  }
  if (pname == 0x82df) {
    return "GL_TEXTURE_IMMUTABLE_LEVELS";
  }
  if (pname != 0x884c) {
    if (pname == 0x884d) {
      return "GL_TEXTURE_COMPARE_FUNC";
    }
    if (pname != 0x90ea) {
      if (pname != 0x912f) {
        return "UNKNOWN";
      }
      return "GL_TEXTURE_IMMUTABLE_FORMAT";
    }
    return "GL_DEPTH_STENCIL_TEXTURE_MODE";
  }
  return "GL_TEXTURE_COMPARE_MODE";
}

Assistant:

const char* TextureBorderClampBase::getPNameString(glw::GLenum pname)
{
	static const char* str_GL_TEXTURE_BASE_LEVEL		 = "GL_TEXTURE_BASE_LEVEL";
	static const char* str_GL_TEXTURE_BORDER_COLOR_EXT   = "GL_TEXTURE_BORDER_COLOR_EXT";
	static const char* str_GL_TEXTURE_MIN_FILTER		 = "GL_TEXTURE_MIN_FILTER";
	static const char* str_GL_TEXTURE_IMMUTABLE_FORMAT   = "GL_TEXTURE_IMMUTABLE_FORMAT";
	static const char* str_GL_TEXTURE_COMPARE_MODE		 = "GL_TEXTURE_COMPARE_MODE";
	static const char* str_GL_TEXTURE_COMPARE_FUNC		 = "GL_TEXTURE_COMPARE_FUNC";
	static const char* str_GL_TEXTURE_MAG_FILTER		 = "GL_TEXTURE_MAG_FILTER";
	static const char* str_GL_TEXTURE_MAX_LEVEL			 = "GL_TEXTURE_MAX_LEVEL";
	static const char* str_GL_TEXTURE_SWIZZLE_R			 = "GL_TEXTURE_SWIZZLE_R";
	static const char* str_GL_TEXTURE_SWIZZLE_G			 = "GL_TEXTURE_SWIZZLE_G";
	static const char* str_GL_TEXTURE_SWIZZLE_B			 = "GL_TEXTURE_SWIZZLE_B";
	static const char* str_GL_TEXTURE_SWIZZLE_A			 = "GL_TEXTURE_SWIZZLE_A";
	static const char* str_GL_TEXTURE_WRAP_S			 = "GL_TEXTURE_WRAP_S";
	static const char* str_GL_TEXTURE_WRAP_T			 = "GL_TEXTURE_WRAP_T";
	static const char* str_GL_TEXTURE_WRAP_R			 = "GL_TEXTURE_WRAP_R";
	static const char* str_GL_DEPTH_STENCIL_TEXTURE_MODE = "GL_DEPTH_STENCIL_TEXTURE_MODE";
	static const char* str_GL_TEXTURE_IMMUTABLE_LEVELS   = "GL_TEXTURE_IMMUTABLE_LEVELS";
	static const char* str_GL_TEXTURE_MAX_LOD			 = "GL_TEXTURE_MAX_LOD";
	static const char* str_GL_TEXTURE_MIN_LOD			 = "GL_TEXTURE_MIN_LOD";
	static const char* str_UNKNOWN						 = "UNKNOWN";

	if (pname == m_glExtTokens.TEXTURE_BORDER_COLOR)
	{
		return str_GL_TEXTURE_BORDER_COLOR_EXT;
	}

	switch (pname)
	{
	case GL_TEXTURE_BASE_LEVEL:
		return str_GL_TEXTURE_BASE_LEVEL;
	case GL_TEXTURE_MIN_FILTER:
		return str_GL_TEXTURE_MIN_FILTER;
	case GL_TEXTURE_IMMUTABLE_FORMAT:
		return str_GL_TEXTURE_IMMUTABLE_FORMAT;
	case GL_TEXTURE_COMPARE_MODE:
		return str_GL_TEXTURE_COMPARE_MODE;
	case GL_TEXTURE_COMPARE_FUNC:
		return str_GL_TEXTURE_COMPARE_FUNC;
	case GL_TEXTURE_MAG_FILTER:
		return str_GL_TEXTURE_MAG_FILTER;
	case GL_TEXTURE_MAX_LEVEL:
		return str_GL_TEXTURE_MAX_LEVEL;
	case GL_TEXTURE_SWIZZLE_R:
		return str_GL_TEXTURE_SWIZZLE_R;
	case GL_TEXTURE_SWIZZLE_G:
		return str_GL_TEXTURE_SWIZZLE_G;
	case GL_TEXTURE_SWIZZLE_B:
		return str_GL_TEXTURE_SWIZZLE_B;
	case GL_TEXTURE_SWIZZLE_A:
		return str_GL_TEXTURE_SWIZZLE_A;
	case GL_TEXTURE_WRAP_S:
		return str_GL_TEXTURE_WRAP_S;
	case GL_TEXTURE_WRAP_T:
		return str_GL_TEXTURE_WRAP_T;
	case GL_TEXTURE_WRAP_R:
		return str_GL_TEXTURE_WRAP_R;
	case GL_DEPTH_STENCIL_TEXTURE_MODE:
		return str_GL_DEPTH_STENCIL_TEXTURE_MODE;
	case GL_TEXTURE_IMMUTABLE_LEVELS:
		return str_GL_TEXTURE_IMMUTABLE_LEVELS;
	case GL_TEXTURE_MAX_LOD:
		return str_GL_TEXTURE_MAX_LOD;
	case GL_TEXTURE_MIN_LOD:
		return str_GL_TEXTURE_MIN_LOD;
	default:
		return str_UNKNOWN;
	}
}